

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChFunction_Base.cpp
# Opt level: O2

double __thiscall
chrono::ChFunction::Compute_mean
          (ChFunction *this,double xmin,double xmax,double sampling_step,int derivate)

{
  int iVar1;
  double dVar2;
  double dVar3;
  
  dVar3 = 0.0;
  iVar1 = 0;
  for (; xmin <= xmax; xmin = xmin + sampling_step) {
    iVar1 = iVar1 + 1;
    dVar2 = xmin;
    (*this->_vptr_ChFunction[10])(this,derivate);
    dVar3 = dVar3 + dVar2;
  }
  return dVar3 / (double)iVar1;
}

Assistant:

double ChFunction::Compute_mean(double xmin, double xmax, double sampling_step, int derivate) const {
    double mret = 0;
    int numpts = 0;
    for (double mx = xmin; mx <= xmax; mx = mx + sampling_step) {
        numpts++;
        mret += this->Get_y_dN(mx, derivate);
    }
    return mret / ((double)numpts);
}